

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

uint8_t hf_hex2bin(uint8_t c,bool *err)

{
  bool *err_local;
  uint8_t c_local;
  undefined1 local_1;
  
  if ((c < 0x30) || (0x39 < c)) {
    if ((c < 0x61) || (0x66 < c)) {
      if ((c < 0x41) || (0x46 < c)) {
        *err = true;
        local_1 = '\0';
      }
      else {
        local_1 = c + 0xc9;
      }
    }
    else {
      local_1 = c + 0xa9;
    }
  }
  else {
    local_1 = c + 0xd0;
  }
  return local_1;
}

Assistant:

static inline uint8_t hf_hex2bin(uint8_t c, bool &err)
{
    if (c >= '0' && c <= '9') {
        return c - '0';
    }
    else if (c >= 'a' && c <= 'f') {
        return c - 'a' + 0xA;
    }
    else if (c >= 'A' && c <= 'F') {
        return c - 'A' + 0xA;
    }

    err = true;
    return 0;
}